

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots_UH
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  double dVar1;
  vectype *coeffs;
  Index IVar2;
  Scalar *pSVar3;
  VectorXd VVar4;
  bool local_e1;
  double local_a8;
  double x;
  double dStack_98;
  bool is_in_domain;
  double val_n11;
  Index i;
  Matrix<double,__1,__1,_0,__1,__1> local_78;
  non_const_type local_60;
  MatrixXd local_58;
  Matrix<double,__1,_1,_0,__1,_1> local_40;
  undefined1 local_30 [8];
  ArrayXd real_eigs;
  bool only_in_domain_local;
  ChebyshevExpansion *this_local;
  vector<double,_std::allocator<double>_> *roots;
  
  real_eigs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._7_1_ =
       only_in_domain;
  coeffs = coef(this);
  companion_matrix((MatrixXd *)&local_78,this,coeffs);
  local_60 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_78);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_58,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_60);
  VVar4 = eigenvalues_upperHessenberg((ChebTools *)&local_40,&local_58,true);
  Eigen::Array<double,-1,1,0,-1,1>::Array<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Array<double,_1,1,0,_1,1> *)local_30,&local_40,
             VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_40);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_58);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_78);
  i._2_1_ = 0;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  for (val_n11 = 0.0; dVar1 = val_n11,
      IVar2 = Eigen::EigenBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_30),
      (long)dVar1 < IVar2; val_n11 = (double)((long)val_n11 + 1)) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)local_30,
                        (Index)val_n11);
    dStack_98 = *pSVar3;
    local_e1 = -1.0 <= dStack_98 && dStack_98 <= 1.0;
    x._7_1_ = local_e1;
    if (((real_eigs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
          _7_1_ & 1) == 0) || (-1.0 <= dStack_98 && dStack_98 <= 1.0)) {
      local_a8 = ((this->m_xmax - this->m_xmin) * dStack_98 + this->m_xmax + this->m_xmin) * 0.5;
      std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_a8);
    }
  }
  i._2_1_ = 1;
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots_UH(bool only_in_domain) const {
        // The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
        // decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
        // in the domain [-1, 1], but it might also include values outside [-1, 1]
        Eigen::ArrayXd real_eigs = eigenvalues_upperHessenberg(companion_matrix(coef()).transpose(), /* balance = */ true);
        
        
        
        std::vector<double> roots;
        for (Eigen::Index i = 0; i < real_eigs.size(); ++i){
            double val_n11 = real_eigs(i);
            const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
            // Keep it if it is in domain, or if you just want all real roots
            if (!only_in_domain || is_in_domain){
                // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
                roots.push_back(x);
            }
        }
        return roots;
    }